

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<long>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  unsigned_long *puVar1;
  CURSOR_TYPE *pCVar2;
  HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *this_00;
  CursorType *pCVar3;
  reference pvVar4;
  ColumnDataScanState *pCVar5;
  pair<unsigned_long,_long> local_40;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pCVar2 = this->included->dmask;
        pCVar5 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
        if (begin < pCVar5 || (ColumnDataScanState *)(pCVar2->scan).next_row_index <= begin) {
          duckdb::ColumnDataCollection::Seek
                    ((ulong)pCVar2->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar2->scan);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          pCVar2->data = *(long **)(pvVar4 + 0x20);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          FlatVector::VerifyFlatVector(pvVar4);
          pvVar4 = pvVar4 + 0x28;
          pCVar2->validity = (ValidityMask *)pvVar4;
          pCVar5 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
        }
        else {
          pvVar4 = (reference)pCVar2->validity;
        }
        if ((*(long *)pvVar4 == 0) ||
           ((*(ulong *)(*(long *)pvVar4 + (begin - (long)pCVar5 >> 6 & 0x3ffffff) * 8) >>
             (begin - (long)pCVar5 & 0x3f) & 1) != 0)) {
          this_00 = this->skip;
          pCVar3 = this->data;
          pCVar5 = (ColumnDataScanState *)(pCVar3->scan).current_row_index;
          if ((ColumnDataScanState *)(pCVar3->scan).next_row_index <= begin || begin < pCVar5) {
            duckdb::ColumnDataCollection::Seek
                      ((ulong)pCVar3->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar3->scan
                      );
            pvVar4 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            pCVar3->data = *(long **)(pvVar4 + 0x20);
            pvVar4 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            FlatVector::VerifyFlatVector(pvVar4);
            pCVar3->validity = (ValidityMask *)(pvVar4 + 0x28);
            pCVar5 = (ColumnDataScanState *)(pCVar3->scan).current_row_index;
          }
          local_40.second = pCVar3->data[(uint)((int)begin - (int)pCVar5)];
          local_40.first = begin;
          duckdb_skiplistlib::skip_list::
          HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
          ::insert(this_00,&local_40);
        }
      }
      begin = (long)&(((ColumnDataScanState *)begin)->current_chunk_state).handles._M_h._M_buckets +
              1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}